

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

bool __thiscall Regex::processElement(Regex *this,Element *cur_node,ParseData *data)

{
  GroupData *pGVar1;
  ElmentType EVar2;
  uint uVar3;
  int iVar4;
  Element *cur_node_00;
  bool bVar5;
  int iVar6;
  Regex *this_00;
  int iVar7;
  Element **ppEVar8;
  
  EVar2 = cur_node->mType;
  bVar5 = true;
  if (EVar2 - TYPE_TERMINAL < 2) {
    if (cur_node->mParent->mType != TYPE_SEQUENCE) {
      __assert_fail("cur_node->mParent->mType == TYPE_SEQUENCE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                    ,0x279,"bool Regex::processElement(Element *, ParseData *)");
    }
    iVar6 = data->cur_pos;
    this_00 = this;
LAB_0011d4de:
    data->match_count = 0;
    bVar5 = processTerminal(this_00,cur_node,data);
    iVar4 = cur_node->mRepeatMax;
    iVar7 = 0;
    do {
      if (iVar4 == -1) {
        if (bVar5 == false) goto LAB_0011d526;
      }
      else if ((bVar5 & iVar7 < iVar4) == 0) goto LAB_0011d522;
      data->cur_pos = data->cur_pos + 1;
      iVar7 = iVar7 + 1;
      data->match_count = iVar7;
      bVar5 = processTerminal(this_00,cur_node,data);
    } while( true );
  }
  if (EVar2 != TYPE_SEQUENCE) {
    if (EVar2 == TYPE_OR) {
      uVar3 = (this->mGroups).mSize;
      cur_node->mGroupNum = uVar3;
      JetHead::vector<Regex::GroupData>::resize(&this->mGroups,uVar3 + 1);
      (this->mGroups).mData[(uint)cur_node->mGroupNum].start_pos = data->cur_pos;
      ppEVar8 = &cur_node->mChild;
      do {
        cur_node_00 = *ppEVar8;
        if (cur_node_00 == (Element *)0x0) goto LAB_0011d54e;
        bVar5 = processSubTree(this,cur_node_00,data);
        ppEVar8 = &cur_node_00->mNext;
      } while (!bVar5);
      pGVar1 = (this->mGroups).mData + (uint)cur_node->mGroupNum;
      pGVar1->end_pos = data->cur_pos;
      std::__cxx11::string::assign((string *)&pGVar1->string,(ulong)data,(long)pGVar1->start_pos);
LAB_0011d56e:
      bVar5 = true;
    }
    else {
LAB_0011d54e:
      bVar5 = false;
    }
  }
  return bVar5;
LAB_0011d522:
  if (bVar5 != false) {
    iVar6 = cur_node->mRepeatMin;
    if (iVar6 <= iVar7) {
      iVar4 = data->cur_pos;
      data->cur_pos = iVar4 + 1;
      data->match_count = iVar7 + 1;
      data->backtrack_pos = (iVar6 + iVar4) - iVar7;
      goto LAB_0011d56e;
    }
    goto LAB_0011d54e;
  }
LAB_0011d526:
  if (cur_node->mRepeatMin <= iVar7) goto LAB_0011d56e;
  if (iVar6 <= data->backtrack_pos) goto LAB_0011d54e;
  iVar6 = iVar6 + -1;
  data->cur_pos = iVar6;
  this_00 = this;
  backtrackGroups(this,data);
  goto LAB_0011d4de;
}

Assistant:

bool	Regex::processElement( Element *cur_node, ParseData *data )
{	
	if ( cur_node->mType == TYPE_OR )
	{
		cur_node->mGroupNum = mGroups.size();
		mGroups.resize( mGroups.size() + 1 );
		mGroups[ cur_node->mGroupNum ].start_pos = data->cur_pos;

		LOG_INFO( "Group %d open at %d", cur_node->mGroupNum, data->cur_pos );

		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( processSubTree( child_node, data ) )
			{
				int len = data->cur_pos - mGroups[ cur_node->mGroupNum ].start_pos;

				mGroups[ cur_node->mGroupNum ].end_pos = data->cur_pos;
				mGroups[ cur_node->mGroupNum ].string.assign( data->string, 
					mGroups[ cur_node->mGroupNum ].start_pos, len );
		
				LOG_INFO( "Group %d closing, with size of %d and value of %s", cur_node->mGroupNum, len, mGroups[ cur_node->mGroupNum ].string.c_str() );
				LOG_INFO( "Group %d start %d, end %d", cur_node->mGroupNum, mGroups[ cur_node->mGroupNum ].start_pos, mGroups[ cur_node->mGroupNum ].end_pos );
				return true;
			}
			child_node = child_node->mNext;
		}
		
		return false;
	}
	if ( cur_node->mType == TYPE_SEQUENCE )
	{
		return true;
	}
	else if ( cur_node->mType == TYPE_TERMINAL || cur_node->mType == TYPE_CLASS )
	{
		assert( cur_node->mParent->mType == TYPE_SEQUENCE );
		
		bool backtrack = false;
		bool res;
		int start_pos = data->cur_pos;
		
		do {
			data->match_count = 0;
			res = processTerminal( cur_node, data );
		
			while ( ( cur_node->mRepeatMax == -1 || data->match_count < cur_node->mRepeatMax ) && res == true )
			{
				data->cur_pos += 1;
				data->match_count += 1;
				res = processTerminal( cur_node, data );
			}
		
			backtrack = false;
			
			if ( res == false )
			{
				if ( data->match_count >= cur_node->mRepeatMin )
					return true;
				else if ( start_pos > data->backtrack_pos )
				{
					LOG_NOTICE( "backtrack %d %d", data->cur_pos, data->backtrack_pos );
					start_pos -= 1;
					data->cur_pos = start_pos;
					backtrack = true;
					backtrackGroups( data );
				}
			}
		} while ( backtrack );

		if ( res && data->match_count >= cur_node->mRepeatMin )
		{
			data->cur_pos += 1;
			data->match_count += 1;
			data->backtrack_pos = data->cur_pos - ( data->match_count - cur_node->mRepeatMin );
			return true;
		}
	}
	
	return false;
}